

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_capi_appender.cpp
# Opt level: O0

void AssertDecimalValueMatches
               (unique_ptr<duckdb::CAPIResult,_std::default_delete<duckdb::CAPIResult>,_true>
                *result,duckdb_decimal expected)

{
  StringRef capturedExpression;
  StringRef capturedExpression_00;
  StringRef capturedExpression_01;
  StringRef capturedExpression_02;
  ExprLhs<const_unsigned_char_&> rhs;
  ExprLhs<const_unsigned_long_&> EVar1;
  AssertionHandler catchAssertionHandler_3;
  AssertionHandler catchAssertionHandler_2;
  AssertionHandler catchAssertionHandler_1;
  AssertionHandler catchAssertionHandler;
  duckdb_decimal actual;
  ITransientExpression *in_stack_fffffffffffffc78;
  ITransientExpression *expr;
  AssertionHandler *in_stack_fffffffffffffc80;
  AssertionHandler *this;
  StringRef *in_stack_fffffffffffffc88;
  AssertionHandler *in_stack_fffffffffffffc90;
  AssertionHandler *this_00;
  char *in_stack_fffffffffffffc98;
  char *pcVar2;
  size_type in_stack_fffffffffffffca0;
  uchar *in_stack_fffffffffffffcb0;
  SourceLineInfo *this_01;
  ITransientExpression local_2d8;
  StringRef local_2c8;
  unsigned_long *local_268;
  AssertionHandler local_220;
  uchar *local_1b0;
  SourceLineInfo local_168;
  StringRef local_158;
  uchar *local_e8;
  SourceLineInfo local_a0;
  StringRef local_90;
  undefined8 local_38;
  undefined8 local_30;
  char *local_28;
  undefined8 local_20;
  undefined8 local_18;
  char *local_10;
  
  duckdb::unique_ptr<duckdb::CAPIResult,_std::default_delete<duckdb::CAPIResult>,_true>::operator->
            ((unique_ptr<duckdb::CAPIResult,_std::default_delete<duckdb::CAPIResult>,_true> *)
             in_stack_fffffffffffffc80);
  duckdb::CAPIResult::Fetch<duckdb_decimal>
            ((CAPIResult *)in_stack_fffffffffffffc90,(idx_t)in_stack_fffffffffffffc88,
             (idx_t)in_stack_fffffffffffffc80);
  local_20 = local_38;
  local_18 = local_30;
  local_10 = local_28;
  local_90 = operator____catch_sr
                       ((char *)in_stack_fffffffffffffc80,(size_t)in_stack_fffffffffffffc78);
  this_01 = &local_a0;
  Catch::SourceLineInfo::SourceLineInfo
            (this_01,
             "/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/test/api/capi/test_capi_appender.cpp"
             ,0x2b);
  Catch::StringRef::StringRef
            ((StringRef *)in_stack_fffffffffffffc90,(char *)in_stack_fffffffffffffc88);
  capturedExpression.m_size = in_stack_fffffffffffffca0;
  capturedExpression.m_start = in_stack_fffffffffffffc98;
  Catch::AssertionHandler::AssertionHandler
            (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,
             (SourceLineInfo *)in_stack_fffffffffffffc80,capturedExpression,
             (Flags)((ulong)in_stack_fffffffffffffc78 >> 0x20));
  local_e8 = (uchar *)Catch::Decomposer::operator<=
                                ((Decomposer *)in_stack_fffffffffffffc78,(uchar *)0x3a1b82);
  Catch::ExprLhs<unsigned_char_const&>::operator==
            ((ExprLhs<const_unsigned_char_&> *)this_01,in_stack_fffffffffffffcb0);
  Catch::AssertionHandler::handleExpr(in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
  Catch::BinaryExpr<const_unsigned_char_&,_const_unsigned_char_&>::~BinaryExpr
            ((BinaryExpr<const_unsigned_char_&,_const_unsigned_char_&> *)0x3a1bd9);
  Catch::AssertionHandler::complete(in_stack_fffffffffffffc80);
  Catch::AssertionHandler::~AssertionHandler(in_stack_fffffffffffffc80);
  local_158 = operator____catch_sr
                        ((char *)in_stack_fffffffffffffc80,(size_t)in_stack_fffffffffffffc78);
  Catch::SourceLineInfo::SourceLineInfo
            (&local_168,
             "/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/test/api/capi/test_capi_appender.cpp"
             ,0x2c);
  Catch::StringRef::StringRef
            ((StringRef *)in_stack_fffffffffffffc90,(char *)in_stack_fffffffffffffc88);
  capturedExpression_00.m_size = in_stack_fffffffffffffca0;
  capturedExpression_00.m_start = in_stack_fffffffffffffc98;
  Catch::AssertionHandler::AssertionHandler
            (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,
             (SourceLineInfo *)in_stack_fffffffffffffc80,capturedExpression_00,
             (Flags)((ulong)in_stack_fffffffffffffc78 >> 0x20));
  rhs = Catch::Decomposer::operator<=((Decomposer *)in_stack_fffffffffffffc78,(uchar *)0x3a1ced);
  local_1b0 = rhs.m_lhs;
  Catch::ExprLhs<unsigned_char_const&>::operator==
            ((ExprLhs<const_unsigned_char_&> *)this_01,rhs.m_lhs);
  Catch::AssertionHandler::handleExpr(in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
  Catch::BinaryExpr<const_unsigned_char_&,_const_unsigned_char_&>::~BinaryExpr
            ((BinaryExpr<const_unsigned_char_&,_const_unsigned_char_&> *)0x3a1d41);
  Catch::AssertionHandler::complete(in_stack_fffffffffffffc80);
  Catch::AssertionHandler::~AssertionHandler(in_stack_fffffffffffffc80);
  pcVar2 = (char *)&local_18;
  local_220.m_assertionInfo.lineInfo =
       (SourceLineInfo)
       operator____catch_sr((char *)in_stack_fffffffffffffc80,(size_t)in_stack_fffffffffffffc78);
  this_00 = &local_220;
  Catch::SourceLineInfo::SourceLineInfo
            ((SourceLineInfo *)this_00,
             "/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/test/api/capi/test_capi_appender.cpp"
             ,0x2d);
  Catch::StringRef::StringRef((StringRef *)this_00,(char *)in_stack_fffffffffffffc88);
  capturedExpression_01.m_size = in_stack_fffffffffffffca0;
  capturedExpression_01.m_start = pcVar2;
  Catch::AssertionHandler::AssertionHandler
            (this_00,in_stack_fffffffffffffc88,(SourceLineInfo *)in_stack_fffffffffffffc80,
             capturedExpression_01,(Flags)((ulong)in_stack_fffffffffffffc78 >> 0x20));
  EVar1 = Catch::Decomposer::operator<=
                    ((Decomposer *)in_stack_fffffffffffffc78,(unsigned_long *)0x3a1ea7);
  local_268 = EVar1.m_lhs;
  Catch::ExprLhs<unsigned_long_const&>::operator==
            ((ExprLhs<const_unsigned_long_&> *)this_01,(unsigned_long *)rhs.m_lhs);
  Catch::AssertionHandler::handleExpr(in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
  Catch::BinaryExpr<const_unsigned_long_&,_const_unsigned_long_&>::~BinaryExpr
            ((BinaryExpr<const_unsigned_long_&,_const_unsigned_long_&> *)0x3a1eff);
  Catch::AssertionHandler::complete(in_stack_fffffffffffffc80);
  Catch::AssertionHandler::~AssertionHandler(in_stack_fffffffffffffc80);
  this = (AssertionHandler *)&stack0xfffffffffffffff0;
  local_2c8 = operator____catch_sr((char *)this,(size_t)in_stack_fffffffffffffc78);
  expr = &local_2d8;
  Catch::SourceLineInfo::SourceLineInfo
            ((SourceLineInfo *)expr,
             "/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/test/api/capi/test_capi_appender.cpp"
             ,0x2e);
  Catch::StringRef::StringRef((StringRef *)this_00,(char *)in_stack_fffffffffffffc88);
  capturedExpression_02.m_size = (size_type)EVar1.m_lhs;
  capturedExpression_02.m_start = pcVar2;
  Catch::AssertionHandler::AssertionHandler
            (this_00,in_stack_fffffffffffffc88,(SourceLineInfo *)this,capturedExpression_02,
             (Flags)((ulong)expr >> 0x20));
  Catch::Decomposer::operator<=((Decomposer *)expr,(long *)0x3a2060);
  Catch::ExprLhs<long_const&>::operator==((ExprLhs<const_long_&> *)this_01,(long *)rhs.m_lhs);
  Catch::AssertionHandler::handleExpr(this,expr);
  Catch::BinaryExpr<const_long_&,_const_long_&>::~BinaryExpr
            ((BinaryExpr<const_long_&,_const_long_&> *)0x3a20a9);
  Catch::AssertionHandler::complete(this);
  Catch::AssertionHandler::~AssertionHandler(this);
  return;
}

Assistant:

void AssertDecimalValueMatches(duckdb::unique_ptr<CAPIResult> &result, duckdb_decimal expected) {
	duckdb_decimal actual;

	actual = result->Fetch<duckdb_decimal>(0, 0);
	REQUIRE(actual.scale == expected.scale);
	REQUIRE(actual.width == expected.width);
	REQUIRE(actual.value.lower == expected.value.lower);
	REQUIRE(actual.value.upper == expected.value.upper);
}